

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# geometry_creation.cpp
# Opt level: O0

Ref<embree::SceneGraph::Node>
embree::SceneGraph::createGarbageHair
          (int hash,size_t numHairs,bool mblur,Ref<embree::SceneGraph::MaterialNode> *material)

{
  undefined8 uVar1;
  ulong uVar2;
  uint uVar3;
  _func_int **pp_Var4;
  reference pvVar5;
  reference pvVar6;
  unsigned_long *puVar7;
  Vec3fx *pVVar8;
  byte in_CL;
  ulong in_RDX;
  int in_ESI;
  Node *in_RDI;
  long *in_R8;
  float r_1;
  float z_1;
  float y_1;
  float x_1;
  size_t i_10;
  float r;
  float z;
  float y;
  float x;
  size_t i_5;
  uint v0;
  size_t i;
  Ref<embree::SceneGraph::HairSetNode> mesh;
  RandomSampler sampler;
  uint hash_1;
  anon_union_4_2_947300a4 v_7;
  anon_union_4_2_947300a4 v_6;
  anon_union_4_2_947300a4 v_5;
  anon_union_4_2_947300a4 v_4;
  anon_union_4_2_947300a4 v_3;
  anon_union_4_2_947300a4 v_2;
  anon_union_4_2_947300a4 v_1;
  anon_union_4_2_947300a4 v;
  uint n;
  uint m;
  uint r2;
  uint r1;
  uint c2;
  uint c1;
  uint n_2;
  uint m_2;
  uint n_3;
  uint m_3;
  uint n_4;
  uint m_4;
  uint n_5;
  uint m_5;
  uint n_6;
  uint m_6;
  uint n_7;
  uint m_7;
  uint n_8;
  uint m_8;
  uint n_9;
  uint m_9;
  uint n_10;
  uint m_10;
  uint n_1;
  uint m_1;
  size_t i_4;
  size_t i_3;
  Vec3fx *old_items;
  size_t i_2;
  size_t i_1;
  size_t i_9;
  size_t i_8;
  Vec3fx *old_items_1;
  size_t i_7;
  size_t i_6;
  size_t new_size_alloced;
  size_t new_size_alloced_1;
  void *in_stack_fffffffffffff9b8;
  size_t in_stack_fffffffffffff9c0;
  size_t in_stack_fffffffffffff9c8;
  size_type in_stack_fffffffffffff9d8;
  undefined4 in_stack_fffffffffffff9e0;
  undefined4 in_stack_fffffffffffff9e4;
  size_t in_stack_fffffffffffffa60;
  Ref<embree::SceneGraph::MaterialNode> *in_stack_fffffffffffffa68;
  undefined8 in_stack_fffffffffffffa70;
  RTCGeometryType type;
  HairSetNode *in_stack_fffffffffffffa78;
  BBox1f in_stack_fffffffffffffa80;
  uint local_554;
  undefined8 local_508;
  undefined8 uStack_500;
  uint local_4f0;
  uint local_4ec;
  uint local_4e8;
  uint local_4e4;
  ulong local_4e0;
  undefined8 local_4d8;
  undefined8 uStack_4d0;
  uint local_4c0;
  uint local_4bc;
  uint local_4b8;
  uint local_4b4;
  ulong local_4b0;
  value_type local_4a4;
  uint local_49c;
  ulong local_498;
  undefined1 local_48d;
  undefined4 local_48c;
  undefined4 local_488;
  undefined4 local_484;
  undefined4 uStack_480;
  long *local_470;
  _func_int **local_468;
  uint local_45c [4];
  byte local_449;
  ulong local_448;
  long **local_428;
  undefined4 *local_420;
  undefined4 *local_418;
  undefined4 *local_410;
  long **local_408;
  _func_int **local_3f8;
  _func_int ***local_3f0;
  _func_int ***local_3e8;
  _func_int ***local_3e0;
  _func_int ***local_3d8;
  _func_int ***local_3d0;
  _func_int ***local_3c8;
  _func_int ***local_3c0;
  _func_int ***local_3b8;
  _func_int ***local_3a8;
  ulong local_398;
  reference local_390;
  ulong local_388;
  reference local_380;
  ulong local_378;
  reference local_370;
  ulong local_368;
  reference local_360;
  uint local_358;
  uint *local_350;
  uint *local_348;
  uint *local_340;
  uint *local_338;
  uint *local_330;
  uint *local_328;
  uint *local_320;
  uint *local_318;
  uint *local_310;
  uint *local_308;
  uint *local_300;
  uint local_2f8;
  uint local_2f4;
  uint local_2f0;
  uint local_2ec;
  uint local_2e8;
  uint local_2e4;
  uint local_2e0;
  uint local_2dc;
  uint local_2d8;
  uint local_2d4;
  uint local_2d0;
  uint local_2cc;
  uint local_2c8;
  uint local_2c4;
  uint local_2c0;
  uint local_2bc;
  uint local_2b8;
  uint local_2b4;
  uint local_2b0;
  uint local_2ac;
  undefined8 *local_2a8;
  uint local_2a0;
  uint local_29c;
  uint local_298;
  uint local_294;
  undefined8 *local_290;
  undefined8 *local_288;
  Vec3fx *local_280;
  undefined8 *local_278;
  Vec3fx *local_270;
  undefined8 local_268;
  undefined8 uStack_260;
  uint local_258;
  uint local_254;
  uint local_250;
  uint local_24c;
  undefined8 local_248;
  undefined8 uStack_240;
  uint local_22c;
  uint local_228;
  uint local_224;
  uint local_220;
  undefined4 local_21c;
  undefined4 local_218;
  undefined4 local_214;
  undefined4 local_210;
  undefined4 local_20c;
  undefined4 local_208;
  uint local_204;
  uint local_200;
  uint local_1fc;
  undefined4 local_1f8;
  undefined4 local_1f4;
  uint local_1f0;
  undefined4 local_1ec;
  undefined4 local_1e8;
  uint local_1e4;
  undefined4 local_1e0;
  undefined4 local_1dc;
  int local_1d8;
  undefined4 local_1d4;
  undefined4 local_1d0;
  int local_1cc;
  undefined4 local_1c8;
  undefined4 local_1c4;
  int local_1c0;
  undefined4 local_1bc;
  undefined4 local_1b8;
  uint local_1b4;
  undefined4 local_1b0;
  undefined4 local_1ac;
  int local_1a8;
  undefined4 local_1a4;
  undefined4 local_1a0;
  int local_19c;
  undefined4 local_198;
  undefined4 local_194;
  int local_190;
  undefined4 local_18c;
  undefined4 local_188;
  uint local_184;
  _func_int **local_180;
  ulong local_170;
  ulong local_168;
  Vec3fx *local_160;
  ulong local_158;
  ulong local_150;
  size_t local_148;
  ulong local_140;
  reference local_138;
  size_t local_130;
  reference local_128;
  Vec3fx *local_120;
  Vec3fx *local_118;
  size_t local_110;
  Vec3fx *local_108;
  reference local_100;
  ulong local_f8;
  ulong local_f0;
  Vec3fx *local_e8;
  ulong local_e0;
  ulong local_d8;
  size_t local_d0;
  ulong local_c8;
  reference local_c0;
  size_t local_b8;
  reference local_b0;
  Vec3fx *local_a8;
  Vec3fx *local_a0;
  size_t local_98;
  Vec3fx *local_90;
  reference local_88;
  unsigned_long local_80 [2];
  ulong local_70;
  ulong local_68;
  reference local_60;
  size_t local_58;
  unsigned_long local_50 [2];
  ulong local_40;
  ulong local_38;
  reference local_30;
  size_t local_28;
  Vec3fx *local_20;
  Vec3fx *local_18;
  Vec3fx *local_10;
  Vec3fx *local_8;
  
  type = (RTCGeometryType)((ulong)in_stack_fffffffffffffa70 >> 0x20);
  local_449 = in_CL & 1;
  local_350 = local_45c;
  local_208 = 0xcc9e2d51;
  local_20c = 0x1b873593;
  local_210 = 0xf;
  local_214 = 0xd;
  local_218 = 5;
  local_21c = 0xe6546b64;
  uVar3 = in_ESI * 0x16a88000 | (uint)(in_ESI * -0x3361d2af) >> 0x11;
  local_204 = uVar3 * 0x1b873593;
  local_200 = (uVar3 * -0x194da000 | local_204 >> 0x13) * 5 + 0xe6546b64;
  uVar3 = (local_200 >> 0x10 ^ local_200) * -0x7a143595;
  local_358 = (uVar3 >> 0xd ^ uVar3) * -0x3d4d51cb;
  local_358 = local_358 >> 0x10 ^ local_358;
  local_448 = in_RDX;
  local_1fc = local_358;
  local_45c[0] = local_358;
  pp_Var4 = (_func_int **)::operator_new(0x118);
  local_48d = 1;
  local_428 = &local_470;
  local_470 = (long *)*in_R8;
  if (local_470 != (long *)0x0) {
    (**(code **)(*local_470 + 0x10))();
  }
  local_488 = 0;
  local_48c = 0x3f800000;
  local_410 = &local_484;
  local_418 = &local_488;
  local_420 = &local_48c;
  local_484 = 0;
  uStack_480 = 0x3f800000;
  HairSetNode::HairSetNode
            (in_stack_fffffffffffffa78,type,in_stack_fffffffffffffa68,in_stack_fffffffffffffa80,
             in_stack_fffffffffffffa60);
  local_48d = 0;
  local_3f0 = &local_468;
  local_3f8 = pp_Var4;
  local_468 = pp_Var4;
  if (pp_Var4 != (_func_int **)0x0) {
    (**(code **)(*pp_Var4 + 0x10))();
  }
  local_408 = &local_470;
  if (local_470 != (long *)0x0) {
    (**(code **)(*local_470 + 0x18))();
  }
  local_3c0 = &local_468;
  std::
  vector<embree::SceneGraph::HairSetNode::Hair,_std::allocator<embree::SceneGraph::HairSetNode::Hair>_>
  ::resize((vector<embree::SceneGraph::HairSetNode::Hair,_std::allocator<embree::SceneGraph::HairSetNode::Hair>_>
            *)CONCAT44(in_stack_fffffffffffff9e4,in_stack_fffffffffffff9e0),
           in_stack_fffffffffffff9d8);
  for (local_498 = 0; local_498 < local_448; local_498 = local_498 + 1) {
    local_348 = local_45c;
    local_184 = local_45c[0];
    local_188 = 0x19660d;
    local_18c = 0x3c6ef35f;
    uVar3 = local_45c[0] * 0x19660d + 0x3c6ef35f;
    if ((local_45c[0] >> 1) % 0x20 == 0) {
      local_300 = local_45c;
      local_1f4 = 0x19660d;
      local_1f8 = 0x3c6ef35f;
      local_554 = local_45c[0];
      local_1f0 = uVar3;
      local_45c[0] = uVar3 * 0x19660d + 0x3c6ef35f;
    }
    else {
      local_554 = (uint)(local_498 << 2);
      local_45c[0] = uVar3;
    }
    local_49c = local_554;
    HairSetNode::Hair::Hair(&local_4a4,local_554,0);
    local_3c8 = &local_468;
    pvVar5 = std::
             vector<embree::SceneGraph::HairSetNode::Hair,_std::allocator<embree::SceneGraph::HairSetNode::Hair>_>
             ::operator[]((vector<embree::SceneGraph::HairSetNode::Hair,_std::allocator<embree::SceneGraph::HairSetNode::Hair>_>
                           *)(local_468 + 0x1b),local_498);
    *pvVar5 = local_4a4;
  }
  local_3d0 = &local_468;
  pvVar6 = std::
           vector<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
           ::operator[]((vector<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
                         *)(local_468 + 0xf),0);
  local_140 = local_448 << 2;
  local_388 = local_140;
  local_380 = pvVar6;
  local_68 = local_140;
  local_60 = pvVar6;
  if (pvVar6->size_alloced < local_140) {
    local_58 = local_140;
    if (pvVar6->size_alloced != 0) {
      local_70 = pvVar6->size_alloced;
      while (local_70 < local_68) {
        local_80[1] = 1;
        local_80[0] = local_70 << 1;
        puVar7 = std::max<unsigned_long>(local_80 + 1,local_80);
        local_70 = *puVar7;
      }
      local_58 = local_70;
    }
  }
  else {
    local_58 = pvVar6->size_alloced;
  }
  local_148 = local_58;
  uVar2 = local_140;
  if (local_140 < pvVar6->size_active) {
    while (local_150 = uVar2, local_150 < pvVar6->size_active) {
      uVar2 = local_150 + 1;
    }
    pvVar6->size_active = local_140;
  }
  local_138 = pvVar6;
  if (local_58 == pvVar6->size_alloced) {
    for (local_158 = pvVar6->size_active; local_158 < local_140; local_158 = local_158 + 1) {
      local_10 = pvVar6->items + local_158;
    }
    pvVar6->size_active = local_140;
  }
  else {
    local_160 = pvVar6->items;
    local_130 = local_58;
    local_128 = pvVar6;
    pVVar8 = (Vec3fx *)alignedMalloc(in_stack_fffffffffffff9c8,in_stack_fffffffffffff9c0);
    pvVar6->items = pVVar8;
    for (local_168 = 0; local_168 < pvVar6->size_active; local_168 = local_168 + 1) {
      local_118 = pvVar6->items + local_168;
      local_120 = local_160 + local_168;
      uVar1 = *(undefined8 *)((long)&local_120->field_0 + 8);
      *(undefined8 *)&local_118->field_0 = *(undefined8 *)&local_120->field_0;
      *(undefined8 *)((long)&local_118->field_0 + 8) = uVar1;
    }
    for (local_170 = pvVar6->size_active; local_170 < local_140; local_170 = local_170 + 1) {
      local_8 = pvVar6->items + local_170;
    }
    local_110 = pvVar6->size_alloced;
    local_108 = local_160;
    local_100 = pvVar6;
    alignedFree(in_stack_fffffffffffff9b8);
    pvVar6->size_active = local_140;
    pvVar6->size_alloced = local_148;
  }
  for (local_4b0 = 0; local_4b0 < local_448 << 2; local_4b0 = local_4b0 + 1) {
    local_308 = local_45c;
    local_1e4 = local_45c[0];
    local_1e8 = 0x19660d;
    local_1ec = 0x3c6ef35f;
    local_1d8 = local_45c[0] * 0x19660d + 0x3c6ef35f;
    local_4b4 = local_45c[0];
    local_310 = local_45c;
    local_1dc = 0x19660d;
    local_1e0 = 0x3c6ef35f;
    local_1cc = local_1d8 * 0x19660d + 0x3c6ef35f;
    local_4b8 = local_45c[0];
    local_318 = local_45c;
    local_1d0 = 0x19660d;
    local_1d4 = 0x3c6ef35f;
    local_1c0 = local_1cc * 0x19660d + 0x3c6ef35f;
    local_4bc = local_45c[0];
    local_320 = local_45c;
    local_1c4 = 0x19660d;
    local_1c8 = 0x3c6ef35f;
    local_4c0 = local_45c[0];
    local_2a8 = &local_4d8;
    local_248 = CONCAT44(local_45c[0],local_45c[0]);
    uStack_240 = CONCAT44(local_45c[0],local_45c[0]);
    local_3d8 = &local_468;
    local_2d8 = local_4c0;
    local_2d4 = local_4c0;
    local_2d0 = local_4bc;
    local_2cc = local_4bc;
    local_2c8 = local_4b8;
    local_2c4 = local_4b8;
    local_2c0 = local_4b4;
    local_2bc = local_4b4;
    local_2b8 = local_4c0;
    local_2b4 = local_4bc;
    local_2b0 = local_4b8;
    local_2ac = local_4b4;
    local_22c = local_4b4;
    local_228 = local_4b8;
    local_224 = local_4bc;
    local_220 = local_4c0;
    local_4d8 = local_248;
    uStack_4d0 = uStack_240;
    local_45c[0] = local_1c0 * 0x19660d + 0x3c6ef35f;
    local_360 = std::
                vector<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
                ::operator[]((vector<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
                              *)(local_468 + 0xf),0);
    local_368 = local_4b0;
    local_270 = local_360->items + local_4b0;
    local_278 = &local_4d8;
    *(undefined8 *)&local_270->field_0 = local_4d8;
    *(undefined8 *)((long)&local_270->field_0 + 8) = uStack_4d0;
  }
  if ((local_449 & 1) != 0) {
    local_3e0 = &local_468;
    pvVar6 = std::
             vector<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
             ::operator[]((vector<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
                           *)(local_468 + 0xf),1);
    local_c8 = local_448 << 2;
    local_398 = local_c8;
    local_390 = pvVar6;
    local_38 = local_c8;
    local_30 = pvVar6;
    if (pvVar6->size_alloced < local_c8) {
      local_28 = local_c8;
      if (pvVar6->size_alloced != 0) {
        local_40 = pvVar6->size_alloced;
        while (local_40 < local_38) {
          local_50[1] = 1;
          local_50[0] = local_40 << 1;
          puVar7 = std::max<unsigned_long>(local_50 + 1,local_50);
          local_40 = *puVar7;
        }
        local_28 = local_40;
      }
    }
    else {
      local_28 = pvVar6->size_alloced;
    }
    local_d0 = local_28;
    uVar2 = local_c8;
    if (local_c8 < pvVar6->size_active) {
      while (local_d8 = uVar2, local_d8 < pvVar6->size_active) {
        uVar2 = local_d8 + 1;
      }
      pvVar6->size_active = local_c8;
    }
    local_c0 = pvVar6;
    if (local_28 == pvVar6->size_alloced) {
      for (local_e0 = pvVar6->size_active; local_e0 < local_c8; local_e0 = local_e0 + 1) {
        local_20 = pvVar6->items + local_e0;
      }
      pvVar6->size_active = local_c8;
    }
    else {
      local_e8 = pvVar6->items;
      local_b8 = local_28;
      local_b0 = pvVar6;
      pVVar8 = (Vec3fx *)alignedMalloc(in_stack_fffffffffffff9c8,in_stack_fffffffffffff9c0);
      pvVar6->items = pVVar8;
      for (local_f0 = 0; local_f0 < pvVar6->size_active; local_f0 = local_f0 + 1) {
        local_a0 = pvVar6->items + local_f0;
        local_a8 = local_e8 + local_f0;
        uVar1 = *(undefined8 *)((long)&local_a8->field_0 + 8);
        *(undefined8 *)&local_a0->field_0 = *(undefined8 *)&local_a8->field_0;
        *(undefined8 *)((long)&local_a0->field_0 + 8) = uVar1;
      }
      for (local_f8 = pvVar6->size_active; local_f8 < local_c8; local_f8 = local_f8 + 1) {
        local_18 = pvVar6->items + local_f8;
      }
      local_98 = pvVar6->size_alloced;
      local_90 = local_e8;
      local_88 = pvVar6;
      alignedFree(in_stack_fffffffffffff9b8);
      pvVar6->size_active = local_c8;
      pvVar6->size_alloced = local_d0;
    }
    for (local_4e0 = 0; local_4e0 < local_448 << 2; local_4e0 = local_4e0 + 1) {
      local_328 = local_45c;
      local_1b4 = local_45c[0];
      local_1b8 = 0x19660d;
      local_1bc = 0x3c6ef35f;
      local_1a8 = local_45c[0] * 0x19660d + 0x3c6ef35f;
      local_4e4 = local_45c[0];
      local_330 = local_45c;
      local_1ac = 0x19660d;
      local_1b0 = 0x3c6ef35f;
      local_19c = local_1a8 * 0x19660d + 0x3c6ef35f;
      local_4e8 = local_45c[0];
      local_338 = local_45c;
      local_1a0 = 0x19660d;
      local_1a4 = 0x3c6ef35f;
      local_190 = local_19c * 0x19660d + 0x3c6ef35f;
      local_4ec = local_45c[0];
      local_340 = local_45c;
      local_194 = 0x19660d;
      local_198 = 0x3c6ef35f;
      local_4f0 = local_45c[0];
      local_290 = &local_508;
      local_268 = CONCAT44(local_45c[0],local_45c[0]);
      uStack_260 = CONCAT44(local_45c[0],local_45c[0]);
      local_3e8 = &local_468;
      local_2f8 = local_4f0;
      local_2f4 = local_4f0;
      local_2f0 = local_4ec;
      local_2ec = local_4ec;
      local_2e8 = local_4e8;
      local_2e4 = local_4e8;
      local_2e0 = local_4e4;
      local_2dc = local_4e4;
      local_2a0 = local_4f0;
      local_29c = local_4ec;
      local_298 = local_4e8;
      local_294 = local_4e4;
      local_258 = local_4e4;
      local_254 = local_4e8;
      local_250 = local_4ec;
      local_24c = local_4f0;
      local_508 = local_268;
      uStack_500 = uStack_260;
      local_45c[0] = local_190 * 0x19660d + 0x3c6ef35f;
      local_370 = std::
                  vector<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
                  ::operator[]((vector<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
                                *)(local_468 + 0xf),1);
      local_378 = local_4e0;
      local_280 = local_370->items + local_4e0;
      local_288 = &local_508;
      *(undefined8 *)&local_280->field_0 = local_508;
      *(undefined8 *)((long)&local_280->field_0 + 8) = uStack_500;
    }
  }
  local_3b8 = &local_468;
  local_180 = local_468;
  (in_RDI->super_RefCount)._vptr_RefCount = local_468;
  if ((in_RDI->super_RefCount)._vptr_RefCount != (_func_int **)0x0) {
    (**(code **)(*(in_RDI->super_RefCount)._vptr_RefCount + 0x10))();
  }
  local_3a8 = &local_468;
  if (local_468 != (_func_int **)0x0) {
    (**(code **)(*local_468 + 0x18))();
  }
  return (Ref<embree::SceneGraph::Node>)in_RDI;
}

Assistant:

Ref<SceneGraph::Node> SceneGraph::createGarbageHair (int hash, size_t numHairs, bool mblur, Ref<MaterialNode> material)
  {
    RandomSampler sampler;
    RandomSampler_init(sampler,hash);
    Ref<SceneGraph::HairSetNode> mesh = new SceneGraph::HairSetNode(RTC_GEOMETRY_TYPE_FLAT_BEZIER_CURVE,material,BBox1f(0,1),mblur?2:1);

    mesh->hairs.resize(numHairs);
    for (size_t i=0; i<numHairs; i++) {
      const unsigned v0 = (RandomSampler_getInt(sampler) % 32 == 0) ? RandomSampler_getUInt(sampler) : unsigned(4*i);
      mesh->hairs[i] = HairSetNode::Hair(v0,0);
    }

    mesh->positions[0].resize(4*numHairs);
    for (size_t i=0; i<4*numHairs; i++) {
      const float x = cast_i2f(RandomSampler_getUInt(sampler));
      const float y = cast_i2f(RandomSampler_getUInt(sampler));
      const float z = cast_i2f(RandomSampler_getUInt(sampler));
      const float r = cast_i2f(RandomSampler_getUInt(sampler));
      mesh->positions[0][i] = Vec3ff(x,y,z,r);
    }

    if (mblur) 
    {
      mesh->positions[1].resize(4*numHairs);
      for (size_t i=0; i<4*numHairs; i++) {
        const float x = cast_i2f(RandomSampler_getUInt(sampler));
        const float y = cast_i2f(RandomSampler_getUInt(sampler));
        const float z = cast_i2f(RandomSampler_getUInt(sampler));
        const float r = cast_i2f(RandomSampler_getUInt(sampler));
        mesh->positions[1][i] = Vec3ff(x,y,z,r);
      }
    }

    return mesh.dynamicCast<SceneGraph::Node>();
  }